

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O1

void CreateBackwardReferencesNH5
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  undefined1 *puVar1;
  BrotliEncoderDictionary **ppBVar2;
  ushort uVar3;
  uint32_t uVar4;
  size_t sVar5;
  size_t sVar6;
  uint16_t *puVar7;
  uint32_t *puVar8;
  BrotliEncoderDictionary *pBVar9;
  HasherCommon *pHVar10;
  uint8_t *puVar11;
  BrotliDictionary *pBVar12;
  undefined8 uVar13;
  undefined1 *puVar14;
  ushort uVar15;
  uint uVar16;
  uint32_t uVar17;
  BrotliEncoderParams *pBVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  undefined1 *puVar22;
  undefined1 *puVar23;
  byte bVar24;
  int iVar25;
  long lVar26;
  ulong uVar27;
  ulong *puVar28;
  long lVar29;
  BrotliEncoderDictionary **ppBVar30;
  BrotliEncoderParams *pBVar31;
  ulong *puVar32;
  uint uVar33;
  int iVar35;
  uint uVar34;
  BrotliEncoderParams *pBVar36;
  ulong uVar37;
  ulong *puVar38;
  BrotliEncoderParams *pBVar39;
  ulong uVar40;
  size_t sVar41;
  ulong uVar42;
  ulong *puVar43;
  int iVar44;
  BrotliEncoderParams *pBVar45;
  ulong *puVar46;
  BrotliEncoderParams *pBVar47;
  undefined1 *puVar48;
  ulong uVar49;
  long lVar50;
  BrotliEncoderParams *pBVar51;
  BrotliEncoderParams *pBVar52;
  int iVar53;
  BrotliEncoderParams *pBVar54;
  BrotliEncoderParams *pBVar55;
  BrotliEncoderParams *pBVar56;
  bool bVar57;
  ulong local_178;
  ulong local_170;
  int local_14c;
  ulong local_138;
  undefined1 *local_130;
  BrotliEncoderParams *local_120;
  BrotliEncoderParams *local_108;
  BrotliEncoderParams *local_e0;
  BrotliEncoderParams *local_d8;
  Command *local_c8;
  uint local_b4;
  BrotliEncoderParams *local_68;
  uint8_t *s1_orig;
  uint8_t *s1_orig_3;
  int last_distance;
  
  pBVar45 = (BrotliEncoderParams *)(1L << ((byte)params->lgwin & 0x3f));
  sVar5 = params->stream_offset;
  local_170 = *last_insert_len;
  pBVar18 = (BrotliEncoderParams *)((position - 3) + num_bytes);
  if (num_bytes < 4) {
    pBVar18 = (BrotliEncoderParams *)position;
  }
  lVar26 = 0x200;
  if (params->quality < 9) {
    lVar26 = 0x40;
  }
  puVar1 = (undefined1 *)(position + num_bytes);
  sVar6 = (params->dictionary).compound.total_size;
  iVar35 = (hasher->privat)._H5.num_last_distances_to_check_;
  if (4 < iVar35) {
    iVar44 = *dist_cache;
    dist_cache[4] = iVar44 + -1;
    dist_cache[5] = iVar44 + 1;
    dist_cache[6] = iVar44 + -2;
    dist_cache[7] = iVar44 + 2;
    *(ulong *)(dist_cache + 8) = CONCAT44(iVar44 + 3,iVar44 + -3);
    if (10 < iVar35) {
      iVar35 = dist_cache[1];
      dist_cache[10] = iVar35 + -1;
      dist_cache[0xb] = iVar35 + 1;
      dist_cache[0xc] = iVar35 + -2;
      dist_cache[0xd] = iVar35 + 2;
      *(ulong *)(dist_cache + 0xe) = CONCAT44(iVar35 + 3,iVar35 + -3);
    }
  }
  if ((undefined1 *)(position + 4) < puVar1) {
    ppBVar2 = &pBVar45[-1].dictionary.contextual.instances_;
    pBVar56 = (BrotliEncoderParams *)(lVar26 + position);
    puVar7 = (hasher->privat)._H5.num_;
    puVar8 = (hasher->privat)._H5.buckets_;
    lVar19 = sVar6 + 1;
    local_c8 = commands;
    do {
      pBVar47 = (BrotliEncoderParams *)ppBVar2;
      if (position < ppBVar2) {
        pBVar47 = (BrotliEncoderParams *)position;
      }
      ppBVar30 = (BrotliEncoderDictionary **)
                 ((long)(((BrotliEncoderParams *)position)->dictionary).compound.chunks +
                 (sVar5 - 0x68));
      if (ppBVar2 <= ppBVar30) {
        ppBVar30 = ppBVar2;
      }
      if ((params->dictionary).contextual.context_based == 0) {
        local_b4 = 0;
        local_68 = (BrotliEncoderParams *)0x0;
      }
      else {
        if ((BrotliEncoderParams *)position == (BrotliEncoderParams *)0x0) {
          local_68 = (BrotliEncoderParams *)0x0;
        }
        else {
          local_68 = (BrotliEncoderParams *)
                     CONCAT71((int7)((ulong)pBVar45 >> 8),
                              ringbuffer
                              [(ulong)&(((BrotliEncoderParams *)(position + -0x578))->dictionary).
                                       field_0x527 & ringbuffer_mask]);
        }
        if (position < (BrotliEncoderParams *)0x2) {
          uVar49 = 0;
        }
        else {
          uVar49 = (ulong)ringbuffer
                          [(ulong)&(((BrotliEncoderParams *)(position + -0x578))->dictionary).
                                   field_0x526 & ringbuffer_mask];
        }
        local_b4 = (uint)(params->dictionary).contextual.context_map
                         [literal_context_lut[uVar49 + 0x100] |
                          literal_context_lut[(ulong)local_68 & 0xff]];
      }
      local_130 = puVar1 + -position;
      pBVar9 = (params->dictionary).contextual.dict[local_b4];
      pBVar45 = (BrotliEncoderParams *)(params->dist).max_distance;
      uVar49 = position & ringbuffer_mask;
      pBVar51 = (BrotliEncoderParams *)(long)(hasher->privat)._H5.num_last_distances_to_check_;
      if (pBVar51 == (BrotliEncoderParams *)0x0) {
        local_138 = 0x7e4;
        local_108 = (BrotliEncoderParams *)0x0;
        local_120 = (BrotliEncoderParams *)0x0;
        pBVar39 = (BrotliEncoderParams *)0x0;
      }
      else {
        local_138 = 0x7e4;
        pBVar39 = (BrotliEncoderParams *)0x0;
        pBVar52 = (BrotliEncoderParams *)0x0;
        local_120 = (BrotliEncoderParams *)0x0;
        local_108 = (BrotliEncoderParams *)0x0;
        pBVar54 = local_68;
        do {
          pBVar36 = (BrotliEncoderParams *)(long)dist_cache[(long)pBVar52];
          if (((pBVar36 <= pBVar47) &&
              ((BrotliEncoderParams *)(position - (long)pBVar36) < position)) &&
             (uVar20 = (long)(pBVar39->dictionary).compound.chunks + (uVar49 - 0x68),
             uVar20 <= ringbuffer_mask)) {
            uVar27 = (ulong)(position - (long)pBVar36) & ringbuffer_mask;
            uVar40 = (long)(pBVar39->dictionary).compound.chunks + (uVar27 - 0x68);
            if ((uVar40 <= ringbuffer_mask) && (ringbuffer[uVar20] == ringbuffer[uVar40])) {
              puVar28 = (ulong *)(ringbuffer + uVar27);
              puVar32 = (ulong *)(ringbuffer + uVar49);
              puVar38 = puVar28;
              for (puVar23 = local_130; (undefined1 *)0x7 < puVar23; puVar23 = puVar23 + -8) {
                uVar20 = *puVar32;
                uVar40 = *puVar38;
                if (uVar20 == uVar40) {
                  puVar38 = puVar38 + 1;
                }
                else {
                  uVar27 = 0;
                  if ((uVar40 ^ uVar20) != 0) {
                    for (; ((uVar40 ^ uVar20) >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                    }
                  }
                  pBVar54 = (BrotliEncoderParams *)
                            ((long)puVar38 + ((uVar27 >> 3 & 0x1fffffff) - (long)puVar28));
                }
                if (uVar20 != uVar40) goto LAB_003116fc;
                puVar32 = puVar32 + 1;
              }
              puVar43 = puVar38;
              if (puVar23 != (undefined1 *)0x0) {
                puVar43 = (ulong *)((long)puVar38 + (long)puVar23);
                lVar29 = 0;
                do {
                  if (*(char *)((long)puVar38 + lVar29) != *(char *)((long)puVar32 + lVar29)) {
                    puVar43 = (ulong *)((long)puVar38 + lVar29);
                    break;
                  }
                  lVar29 = lVar29 + 1;
                } while (puVar23 != (undefined1 *)lVar29);
              }
              pBVar54 = (BrotliEncoderParams *)((long)puVar43 - (long)puVar28);
LAB_003116fc:
              if ((((BrotliEncoderParams *)0x2 < pBVar54) ||
                  ((pBVar52 < (BrotliEncoderParams *)0x2 && (pBVar54 == (BrotliEncoderParams *)0x2))
                  )) && (uVar20 = (long)pBVar54 * 0x87 + 0x78f, local_138 < uVar20)) {
                if (pBVar52 != (BrotliEncoderParams *)0x0) {
                  uVar20 = uVar20 - ((0x1ca10U >> ((byte)pBVar52 & 0xe) & 0xe) + 0x27);
                }
                if (local_138 < uVar20) {
                  pBVar39 = pBVar54;
                  local_138 = uVar20;
                  local_120 = pBVar54;
                  local_108 = pBVar36;
                }
              }
            }
          }
          pBVar52 = (BrotliEncoderParams *)((long)&pBVar52->mode + 1);
        } while (pBVar52 != pBVar51);
      }
      uVar33 = (uint)(*(int *)(ringbuffer + uVar49) * 0x1e35a7bd) >>
               (*(byte *)((long)&hasher->privat + 0x10) & 0x1f);
      puVar32 = (ulong *)(ringbuffer + uVar49);
      uVar16 = uVar33 << (*(byte *)((long)&hasher->privat + 0x18) & 0x1f);
      uVar3 = puVar7[uVar33];
      uVar27 = (ulong)uVar3;
      uVar20 = (hasher->privat)._H5.block_size_;
      uVar40 = 0;
      if (uVar20 <= uVar27) {
        uVar40 = uVar27 - uVar20;
      }
      do {
        if (uVar27 <= uVar40) break;
        uVar27 = uVar27 - 1;
        pBVar54 = (BrotliEncoderParams *)
                  (position -
                  puVar8[(ulong)uVar16 + (ulong)((hasher->privat)._H5.block_mask_ & (uint)uVar27)]);
        if ((pBVar54 <= pBVar47) &&
           (uVar21 = (long)(pBVar39->dictionary).compound.chunks + (uVar49 - 0x68),
           uVar21 <= ringbuffer_mask)) {
          uVar42 = (ulong)(puVar8[(ulong)uVar16 +
                                  (ulong)((hasher->privat)._H5.block_mask_ & (uint)uVar27)] &
                          (uint)ringbuffer_mask);
          uVar37 = (long)(pBVar39->dictionary).compound.chunks + (uVar42 - 0x68);
          if ((uVar37 <= ringbuffer_mask) && (ringbuffer[uVar21] == ringbuffer[uVar37])) {
            puVar43 = (ulong *)(ringbuffer + uVar42);
            puVar38 = puVar32;
            puVar28 = puVar43;
            for (puVar23 = local_130; (undefined1 *)0x7 < puVar23; puVar23 = puVar23 + -8) {
              uVar21 = *puVar38;
              uVar37 = *puVar28;
              if (uVar21 == uVar37) {
                puVar28 = puVar28 + 1;
              }
              else {
                uVar42 = 0;
                if ((uVar37 ^ uVar21) != 0) {
                  for (; ((uVar37 ^ uVar21) >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                  }
                }
                pBVar51 = (BrotliEncoderParams *)
                          ((long)puVar28 + ((uVar42 >> 3 & 0x1fffffff) - (long)puVar43));
              }
              if (uVar21 != uVar37) goto LAB_003118e1;
              puVar38 = puVar38 + 1;
            }
            puVar46 = puVar28;
            if (puVar23 != (undefined1 *)0x0) {
              puVar46 = (ulong *)((long)puVar28 + (long)puVar23);
              lVar29 = 0;
              do {
                if (*(char *)((long)puVar28 + lVar29) != *(char *)((long)puVar38 + lVar29)) {
                  puVar46 = (ulong *)((long)puVar28 + lVar29);
                  break;
                }
                lVar29 = lVar29 + 1;
              } while (puVar23 != (undefined1 *)lVar29);
            }
            pBVar51 = (BrotliEncoderParams *)((long)puVar46 - (long)puVar43);
LAB_003118e1:
            if ((BrotliEncoderParams *)0x3 < pBVar51) {
              iVar35 = 0x1f;
              if ((uint)pBVar54 != 0) {
                for (; (uint)pBVar54 >> iVar35 == 0; iVar35 = iVar35 + -1) {
                }
              }
              uVar21 = (ulong)(iVar35 * -0x1e + 0x780) + (long)pBVar51 * 0x87;
              if (local_138 < uVar21) {
                pBVar39 = pBVar51;
                local_138 = uVar21;
                local_120 = pBVar51;
                local_108 = pBVar54;
              }
            }
          }
        }
      } while (pBVar54 <= pBVar47);
      puVar8[(ulong)uVar16 + (ulong)((hasher->privat)._H5.block_mask_ & (uint)uVar3)] =
           (uint32_t)position;
      puVar7[uVar33] = uVar3 + 1;
      if (local_138 == 0x7e4) {
        pHVar10 = (hasher->privat)._H5.common_;
        if (pHVar10->dict_num_matches < pHVar10->dict_num_lookups >> 7) {
          local_14c = 0;
        }
        else {
          pBVar47 = (BrotliEncoderParams *)
                    (ulong)((uint)((int)*puVar32 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
          puVar11 = pBVar9->hash_table_lengths;
          sVar41 = pHVar10->dict_num_lookups;
          local_14c = 0;
          lVar29 = 0;
          pBVar51 = (BrotliEncoderParams *)ringbuffer;
          do {
            sVar41 = sVar41 + 1;
            pHVar10->dict_num_lookups = sVar41;
            bVar24 = *(byte *)((long)(pBVar47->dictionary).compound.chunks + (long)(puVar11 + -0x68)
                              );
            puVar23 = (undefined1 *)(ulong)bVar24;
            if (puVar23 != (undefined1 *)0x0) {
              bVar57 = true;
              if (puVar23 <= local_130) {
                pBVar12 = pBVar9->words;
                puVar28 = (ulong *)(pBVar12->data +
                                   (ulong)pBVar12->offsets_by_length[(long)puVar23] +
                                   (ulong)pBVar9->hash_table_words[(long)pBVar47] * (long)puVar23);
                puVar22 = puVar23;
                puVar38 = puVar32;
                if (7 < bVar24) {
                  do {
                    uVar49 = *puVar28;
                    uVar40 = *puVar38;
                    if (uVar49 == uVar40) {
                      puVar38 = puVar38 + 1;
                    }
                    else {
                      uVar27 = 0;
                      if ((uVar40 ^ uVar49) != 0) {
                        for (; ((uVar40 ^ uVar49) >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                        }
                      }
                      pBVar51 = (BrotliEncoderParams *)
                                ((long)puVar38 + ((uVar27 >> 3 & 0x1fffffff) - (long)puVar32));
                    }
                    if (uVar49 != uVar40) goto LAB_00312326;
                    puVar28 = puVar28 + 1;
                    puVar22 = puVar22 + -8;
                  } while ((undefined1 *)0x7 < puVar22);
                }
                if (puVar22 != (undefined1 *)0x0) {
                  puVar48 = (undefined1 *)0x0;
                  do {
                    puVar14 = puVar48;
                    if (*(char *)((long)puVar38 + (long)puVar48) !=
                        *(char *)((long)puVar28 + (long)puVar48)) break;
                    puVar48 = puVar48 + 1;
                    puVar14 = puVar22;
                  } while (puVar22 != puVar48);
                  puVar38 = (ulong *)((long)puVar38 + (long)puVar14);
                }
                pBVar51 = (BrotliEncoderParams *)((long)puVar38 - (long)puVar32);
LAB_00312326:
                if (((pBVar51 != (BrotliEncoderParams *)0x0) &&
                    (puVar23 < (undefined1 *)
                               ((long)(pBVar51->dictionary).compound.chunks +
                               ((ulong)pBVar9->cutoffTransformsCount - 0x68)))) &&
                   (pBVar39 = (BrotliEncoderParams *)
                              ((long)ppBVar30 +
                              ((ulong)((uint)(pBVar9->cutoffTransforms >>
                                             ((char)((long)puVar23 - (long)pBVar51) * '\x06' & 0x3fU
                                             )) & 0x3f) + ((long)puVar23 - (long)pBVar51) * 4 <<
                              (puVar23[(long)pBVar12] & 0x3f)) +
                              (ulong)pBVar9->hash_table_words[(long)pBVar47] + lVar19),
                   pBVar39 <= pBVar45)) {
                  iVar35 = 0x1f;
                  if ((uint)pBVar39 != 0) {
                    for (; (uint)pBVar39 >> iVar35 == 0; iVar35 = iVar35 + -1) {
                    }
                  }
                  uVar49 = ((long)pBVar51 * 0x87 - (ulong)(uint)(iVar35 * 0x1e)) + 0x780;
                  if (local_138 <= uVar49) {
                    local_14c = (uint)bVar24 - (int)pBVar51;
                    bVar57 = false;
                    local_138 = uVar49;
                    local_120 = pBVar51;
                    local_108 = pBVar39;
                  }
                }
              }
              if (!bVar57) {
                pHVar10->dict_num_matches = pHVar10->dict_num_matches + 1;
              }
            }
            pBVar47 = (BrotliEncoderParams *)((long)&pBVar47->mode + 1);
            bVar57 = lVar29 == 0;
            lVar29 = lVar29 + 1;
          } while (bVar57);
        }
      }
      else {
        local_14c = 0;
      }
      if (local_138 < 0x7e5) {
        local_170 = local_170 + 1;
        pBVar45 = (BrotliEncoderParams *)((long)&((BrotliEncoderParams *)position)->mode + 1);
        if (pBVar56 < pBVar45) {
          if ((BrotliEncoderParams *)
              ((long)(pBVar56->dictionary).compound.chunks + ((ulong)(uint)((int)lVar26 * 4) - 0x68)
              ) < pBVar45) {
            pBVar47 = (BrotliEncoderParams *)
                      ((long)&((BrotliEncoderParams *)position)->stream_offset + 1);
            if ((BrotliEncoderParams *)(puVar1 + -4) <= pBVar47) {
              pBVar47 = (BrotliEncoderParams *)(puVar1 + -4);
            }
            if (pBVar45 < pBVar47) {
              uVar17 = (hasher->privat)._H35.hb.state;
              uVar16 = (hasher->privat)._H5.block_mask_;
              uVar4 = (hasher->privat)._H6.block_mask_;
              do {
                uVar33 = (uint)(*(int *)(ringbuffer + ((ulong)pBVar45 & ringbuffer_mask)) *
                               0x1e35a7bd) >> ((byte)uVar17 & 0x1f);
                uVar3 = puVar7[uVar33];
                puVar8[(ulong)(uVar16 & uVar3) + (ulong)(uVar33 << ((byte)uVar4 & 0x1f))] =
                     (uint32_t)pBVar45;
                puVar7[uVar33] = uVar3 + 1;
                local_170 = local_170 + 4;
                pBVar45 = (BrotliEncoderParams *)&pBVar45->quality;
              } while (pBVar45 < pBVar47);
            }
          }
          else {
            pBVar47 = (BrotliEncoderParams *)((long)&((BrotliEncoderParams *)position)->lgwin + 1);
            if ((BrotliEncoderParams *)(puVar1 + -3) <= pBVar47) {
              pBVar47 = (BrotliEncoderParams *)(puVar1 + -3);
            }
            if (pBVar45 < pBVar47) {
              uVar17 = (hasher->privat)._H35.hb.state;
              uVar16 = (hasher->privat)._H5.block_mask_;
              uVar4 = (hasher->privat)._H6.block_mask_;
              do {
                uVar33 = (uint)(*(int *)(ringbuffer + ((ulong)pBVar45 & ringbuffer_mask)) *
                               0x1e35a7bd) >> ((byte)uVar17 & 0x1f);
                uVar3 = puVar7[uVar33];
                puVar8[(ulong)(uVar16 & uVar3) + (ulong)(uVar33 << ((byte)uVar4 & 0x1f))] =
                     (uint32_t)pBVar45;
                puVar7[uVar33] = uVar3 + 1;
                local_170 = local_170 + 2;
                pBVar45 = (BrotliEncoderParams *)((long)&pBVar45->mode + 2);
              } while (pBVar45 < pBVar47);
            }
          }
        }
      }
      else {
        iVar35 = (hasher->privat)._H5.num_last_distances_to_check_;
        uVar17 = (hasher->privat)._H35.hb.state;
        uVar16 = (hasher->privat)._H5.block_mask_;
        uVar4 = (hasher->privat)._H6.block_mask_;
        iVar44 = 0;
        do {
          local_130 = local_130 + -1;
          pBVar56 = (BrotliEncoderParams *)&local_120[-1].dictionary.field_0x527;
          if (local_130 <= pBVar56) {
            pBVar56 = (BrotliEncoderParams *)local_130;
          }
          if (4 < params->quality) {
            pBVar56 = (BrotliEncoderParams *)0x0;
          }
          pBVar51 = (BrotliEncoderParams *)((long)&((BrotliEncoderParams *)position)->mode + 1);
          pBVar39 = (BrotliEncoderParams *)ppBVar2;
          if (pBVar51 < ppBVar2) {
            pBVar39 = pBVar51;
          }
          ppBVar30 = (BrotliEncoderDictionary **)
                     ((long)(((BrotliEncoderParams *)position)->dictionary).compound.chunks +
                     (sVar5 - 0x67));
          if (ppBVar2 <= ppBVar30) {
            ppBVar30 = ppBVar2;
          }
          if ((params->dictionary).contextual.context_based != 0) {
            uVar49 = (ulong)local_68 & 0xff;
            local_68 = (BrotliEncoderParams *)(ulong)ringbuffer[position & ringbuffer_mask];
            local_b4 = (uint)(params->dictionary).contextual.context_map
                             [literal_context_lut[uVar49 + 0x100] |
                              literal_context_lut[(long)local_68]];
          }
          uVar49 = (ulong)pBVar51 & ringbuffer_mask;
          pBVar9 = (params->dictionary).contextual.dict[local_b4];
          pBVar54 = params;
          if (iVar35 == 0) {
            local_178 = 0x7e4;
            local_d8 = (BrotliEncoderParams *)0x0;
            local_e0 = (BrotliEncoderParams *)0x0;
          }
          else {
            pBVar47 = (BrotliEncoderParams *)(ringbuffer + uVar49);
            local_178 = 0x7e4;
            uVar40 = 0;
            local_e0 = (BrotliEncoderParams *)0x0;
            local_d8 = (BrotliEncoderParams *)0x0;
            do {
              pBVar52 = (BrotliEncoderParams *)(long)dist_cache[uVar40];
              if (((pBVar52 <= pBVar39) &&
                  ((BrotliEncoderParams *)((long)pBVar51 - (long)pBVar52) < pBVar51)) &&
                 (uVar27 = (long)(pBVar56->dictionary).compound.chunks + (uVar49 - 0x68),
                 uVar27 <= ringbuffer_mask)) {
                uVar21 = (ulong)((long)pBVar51 - (long)pBVar52) & ringbuffer_mask;
                pBVar36 = (BrotliEncoderParams *)
                          ((long)(pBVar56->dictionary).compound.chunks + (uVar21 - 0x68));
                if ((pBVar36 <= ringbuffer_mask) &&
                   (ringbuffer[uVar27] == ringbuffer[(long)pBVar36])) {
                  pBVar31 = (BrotliEncoderParams *)(ringbuffer + uVar21);
                  pBVar55 = pBVar47;
                  pBVar54 = pBVar31;
                  for (puVar23 = local_130; (undefined1 *)0x7 < puVar23; puVar23 = puVar23 + -8) {
                    uVar27._0_4_ = pBVar55->mode;
                    uVar27._4_4_ = pBVar55->quality;
                    uVar21._0_4_ = pBVar54->mode;
                    uVar21._4_4_ = pBVar54->quality;
                    if (uVar27 == uVar21) {
                      pBVar54 = (BrotliEncoderParams *)&pBVar54->lgwin;
                    }
                    else {
                      uVar37 = 0;
                      if ((uVar21 ^ uVar27) != 0) {
                        for (; ((uVar21 ^ uVar27) >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                        }
                      }
                      pBVar36 = (BrotliEncoderParams *)
                                ((long)pBVar54 + ((uVar37 >> 3 & 0x1fffffff) - (long)pBVar31));
                    }
                    if (uVar27 != uVar21) goto LAB_00311bc3;
                    pBVar55 = (BrotliEncoderParams *)&pBVar55->lgwin;
                  }
                  if (puVar23 != (undefined1 *)0x0) {
                    puVar22 = (undefined1 *)0x0;
                    do {
                      puVar48 = puVar22;
                      if ((puVar22 + -0x50)[(long)(&(pBVar54->dictionary).compound + -1) + 0x210] !=
                          (puVar22 + -0x50)[(long)(&(pBVar55->dictionary).compound + -1) + 0x210])
                      break;
                      puVar22 = puVar22 + 1;
                      puVar48 = puVar23;
                    } while (puVar23 != puVar22);
                    pBVar54 = (BrotliEncoderParams *)
                              (puVar48 + -0x50 +
                              (long)(&(pBVar54->dictionary).compound + -1) + 0x210);
                  }
                  pBVar36 = (BrotliEncoderParams *)((long)pBVar54 - (long)pBVar31);
                  pBVar54 = pBVar36;
LAB_00311bc3:
                  if ((((BrotliEncoderParams *)0x2 < pBVar36) ||
                      ((uVar40 < 2 && (pBVar36 == (BrotliEncoderParams *)0x2)))) &&
                     (uVar27 = (long)pBVar36 * 0x87 + 0x78f, local_178 < uVar27)) {
                    if (uVar40 != 0) {
                      pBVar54 = (BrotliEncoderParams *)
                                (ulong)((0x1ca10U >> ((byte)uVar40 & 0xe) & 0xe) + 0x27);
                      uVar27 = uVar27 - (long)pBVar54;
                    }
                    if (local_178 < uVar27) {
                      pBVar56 = pBVar36;
                      local_178 = uVar27;
                      local_e0 = pBVar36;
                      local_d8 = pBVar52;
                    }
                  }
                }
              }
              uVar40 = uVar40 + 1;
            } while (uVar40 != (long)iVar35);
          }
          pBVar52 = (BrotliEncoderParams *)(ringbuffer + uVar49);
          uVar34 = (uint)(*(int *)(ringbuffer + uVar49) * 0x1e35a7bd) >> ((byte)uVar17 & 0x1f);
          uVar33 = uVar34 << ((byte)uVar4 & 0x1f);
          uVar3 = puVar7[uVar34];
          uVar27 = (ulong)uVar3;
          uVar40 = 0;
          if (uVar20 <= uVar27) {
            uVar40 = uVar27 - uVar20;
          }
          do {
            if (uVar27 <= uVar40) break;
            uVar27 = uVar27 - 1;
            pBVar36 = (BrotliEncoderParams *)
                      ((long)pBVar51 -
                      (ulong)puVar8[(ulong)uVar33 +
                                    (ulong)((hasher->privat)._H5.block_mask_ & (uint)uVar27)]);
            if ((pBVar36 <= pBVar39) &&
               (uVar21 = (long)(pBVar56->dictionary).compound.chunks + (uVar49 - 0x68),
               uVar21 <= ringbuffer_mask)) {
              uVar37 = (ulong)(puVar8[(ulong)uVar33 +
                                      (ulong)((hasher->privat)._H5.block_mask_ & (uint)uVar27)] &
                              (uint)ringbuffer_mask);
              pBVar54 = (BrotliEncoderParams *)
                        ((long)(pBVar56->dictionary).compound.chunks + (uVar37 - 0x68));
              if ((pBVar54 <= ringbuffer_mask) && (ringbuffer[uVar21] == ringbuffer[(long)pBVar54]))
              {
                puVar38 = (ulong *)(ringbuffer + uVar37);
                pBVar55 = pBVar52;
                puVar32 = puVar38;
                for (puVar23 = local_130; (undefined1 *)0x7 < puVar23; puVar23 = puVar23 + -8) {
                  uVar37._0_4_ = pBVar55->mode;
                  uVar37._4_4_ = pBVar55->quality;
                  uVar21 = *puVar32;
                  if (uVar37 == uVar21) {
                    puVar32 = puVar32 + 1;
                  }
                  else {
                    uVar42 = 0;
                    if ((uVar21 ^ uVar37) != 0) {
                      for (; ((uVar21 ^ uVar37) >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                      }
                    }
                    pBVar54 = (BrotliEncoderParams *)((long)puVar32 - (long)puVar38);
                    pBVar47 = (BrotliEncoderParams *)
                              ((long)(pBVar54->dictionary).compound.chunks +
                              ((uVar42 >> 3 & 0x1fffffff) - 0x68));
                  }
                  if (uVar37 != uVar21) goto LAB_00311da1;
                  pBVar55 = (BrotliEncoderParams *)&pBVar55->lgwin;
                }
                puVar28 = puVar32;
                if (puVar23 != (undefined1 *)0x0) {
                  puVar28 = (ulong *)((long)puVar32 + (long)puVar23);
                  lVar29 = 0;
                  do {
                    pBVar54 = (BrotliEncoderParams *)
                              CONCAT71((int7)((ulong)pBVar54 >> 8),*(char *)((long)puVar32 + lVar29)
                                      );
                    if (*(char *)((long)puVar32 + lVar29) !=
                        *(char *)((long)(pBVar55->dictionary).compound.chunks + lVar29 + -0x68)) {
                      puVar28 = (ulong *)((long)puVar32 + lVar29);
                      break;
                    }
                    lVar29 = lVar29 + 1;
                  } while (puVar23 != (undefined1 *)lVar29);
                }
                pBVar47 = (BrotliEncoderParams *)((long)puVar28 - (long)puVar38);
LAB_00311da1:
                if ((BrotliEncoderParams *)0x3 < pBVar47) {
                  iVar53 = 0x1f;
                  if ((uint)pBVar36 != 0) {
                    for (; (uint)pBVar36 >> iVar53 == 0; iVar53 = iVar53 + -1) {
                    }
                  }
                  uVar21 = (ulong)(iVar53 * -0x1e + 0x780) + (long)pBVar47 * 0x87;
                  if (local_178 < uVar21) {
                    pBVar56 = pBVar47;
                    local_178 = uVar21;
                    local_e0 = pBVar47;
                    local_d8 = pBVar36;
                  }
                }
              }
            }
          } while (pBVar36 <= pBVar39);
          puVar8[(ulong)uVar33 + (ulong)(uVar16 & uVar3)] = (uint32_t)pBVar51;
          puVar7[uVar34] = uVar3 + 1;
          if (local_178 == 0x7e4) {
            pHVar10 = (hasher->privat)._H5.common_;
            if (pHVar10->dict_num_matches < pHVar10->dict_num_lookups >> 7) {
              iVar53 = 0;
            }
            else {
              uVar49 = (ulong)(pBVar52->mode * 0x1e35a7bd >> 0x11 & 0xfffffffe);
              puVar11 = pBVar9->hash_table_lengths;
              sVar41 = pHVar10->dict_num_lookups;
              iVar53 = 0;
              lVar29 = 0;
              do {
                sVar41 = sVar41 + 1;
                pHVar10->dict_num_lookups = sVar41;
                bVar24 = puVar11[uVar49];
                puVar23 = (undefined1 *)(ulong)bVar24;
                if (puVar23 != (undefined1 *)0x0) {
                  bVar57 = true;
                  if (puVar23 <= local_130) {
                    pBVar12 = pBVar9->words;
                    puVar32 = (ulong *)(pBVar12->data +
                                       (ulong)pBVar12->offsets_by_length[(long)puVar23] +
                                       (ulong)pBVar9->hash_table_words[uVar49] * (long)puVar23);
                    puVar22 = puVar23;
                    pBVar47 = pBVar52;
                    if (7 < bVar24) {
                      do {
                        uVar40 = *puVar32;
                        uVar42._0_4_ = pBVar47->mode;
                        uVar42._4_4_ = pBVar47->quality;
                        if (uVar40 == uVar42) {
                          pBVar47 = (BrotliEncoderParams *)&pBVar47->lgwin;
                        }
                        else {
                          uVar27 = 0;
                          if ((uVar42 ^ uVar40) != 0) {
                            for (; ((uVar42 ^ uVar40) >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                            }
                          }
                          pBVar54 = (BrotliEncoderParams *)
                                    ((long)pBVar47 + ((uVar27 >> 3 & 0x1fffffff) - (long)pBVar52));
                        }
                        if (uVar40 != uVar42) goto LAB_00311fd7;
                        puVar32 = puVar32 + 1;
                        puVar22 = puVar22 + -8;
                      } while ((undefined1 *)0x7 < puVar22);
                    }
                    pBVar54 = pBVar47;
                    if (puVar22 != (undefined1 *)0x0) {
                      pBVar54 = (BrotliEncoderParams *)
                                (puVar22 + -0x50 +
                                (long)(&(pBVar47->dictionary).compound + -1) + 0x210);
                      lVar50 = 0;
                      do {
                        if (*(char *)((long)(pBVar47->dictionary).compound.chunks + lVar50 + -0x68)
                            != *(char *)((long)puVar32 + lVar50)) {
                          pBVar54 = (BrotliEncoderParams *)
                                    ((long)(pBVar47->dictionary).compound.chunks + lVar50 + -0x68);
                          break;
                        }
                        lVar50 = lVar50 + 1;
                      } while (puVar22 != (undefined1 *)lVar50);
                    }
                    pBVar54 = (BrotliEncoderParams *)((long)pBVar54 - (long)pBVar52);
                    pBVar47 = pBVar54;
LAB_00311fd7:
                    if (((pBVar54 != (BrotliEncoderParams *)0x0) &&
                        (puVar23 < (undefined1 *)
                                   ((long)(pBVar54->dictionary).compound.chunks +
                                   ((ulong)pBVar9->cutoffTransformsCount - 0x68)))) &&
                       (pBVar56 = (BrotliEncoderParams *)
                                  ((long)ppBVar30 +
                                  ((ulong)((uint)(pBVar9->cutoffTransforms >>
                                                 ((char)((long)puVar23 - (long)pBVar54) * '\x06' &
                                                 0x3fU)) & 0x3f) +
                                   ((long)puVar23 - (long)pBVar54) * 4 <<
                                  (puVar23[(long)pBVar12] & 0x3f)) +
                                  (ulong)pBVar9->hash_table_words[uVar49] + lVar19),
                       pBVar56 <= pBVar45)) {
                      iVar25 = 0x1f;
                      if ((uint)pBVar56 != 0) {
                        for (; (uint)pBVar56 >> iVar25 == 0; iVar25 = iVar25 + -1) {
                        }
                      }
                      uVar40 = ((long)pBVar54 * 0x87 - (ulong)(uint)(iVar25 * 0x1e)) + 0x780;
                      if (local_178 <= uVar40) {
                        iVar53 = (uint)bVar24 - (int)pBVar54;
                        bVar57 = false;
                        local_178 = uVar40;
                        local_e0 = pBVar54;
                        local_d8 = pBVar56;
                      }
                    }
                  }
                  if (!bVar57) {
                    pHVar10->dict_num_matches = pHVar10->dict_num_matches + 1;
                  }
                }
                uVar49 = uVar49 + 1;
                bVar57 = lVar29 == 0;
                lVar29 = lVar29 + 1;
              } while (bVar57);
            }
          }
          else {
            iVar53 = 0;
          }
          if (local_178 < local_138 + 0xaf) {
            bVar57 = false;
            pBVar51 = (BrotliEncoderParams *)position;
            iVar25 = iVar44;
          }
          else {
            local_170 = local_170 + 1;
            iVar25 = iVar44 + 1;
            bVar57 = iVar44 < 3 &&
                     (undefined1 *)((long)&((BrotliEncoderParams *)position)->quality + 1U) < puVar1
            ;
            local_138 = local_178;
            local_108 = local_d8;
            local_120 = local_e0;
            local_14c = iVar53;
          }
          position = (size_t)pBVar51;
          iVar44 = iVar25;
        } while (bVar57);
        ppBVar30 = (BrotliEncoderDictionary **)
                   ((long)(pBVar51->dictionary).compound.chunks + (sVar5 - 0x68));
        if (ppBVar2 <= ppBVar30) {
          ppBVar30 = ppBVar2;
        }
        pBVar45 = (BrotliEncoderParams *)((long)ppBVar30 + sVar6);
        if (pBVar45 < local_108) {
LAB_003124c3:
          puVar23 = (undefined1 *)((long)&local_108->lgblock + 3);
        }
        else {
          uVar16 = 0;
          bVar57 = false;
          if (local_108 != (BrotliEncoderParams *)(long)*dist_cache) {
            if (local_108 == (BrotliEncoderParams *)(long)dist_cache[1]) {
              uVar16 = 1;
LAB_00312135:
              bVar57 = false;
            }
            else {
              uVar49 = (long)local_108 + (3 - (long)*dist_cache);
              if (uVar49 < 7) {
                iVar35 = (int)uVar49;
                uVar16 = 0x9750468;
              }
              else {
                uVar49 = (long)local_108 + (3 - (long)dist_cache[1]);
                if (6 < uVar49) {
                  if (local_108 != (BrotliEncoderParams *)(long)dist_cache[2]) {
                    bVar57 = local_108 != (BrotliEncoderParams *)(long)dist_cache[3];
                    uVar16 = 3;
                    goto LAB_003124bf;
                  }
                  uVar16 = 2;
                  goto LAB_00312135;
                }
                iVar35 = (int)uVar49;
                uVar16 = 0xfdb1ace;
              }
              uVar16 = uVar16 >> ((byte)(iVar35 << 2) & 0x1f) & 0xf;
              bVar57 = false;
            }
          }
LAB_003124bf:
          if (bVar57) goto LAB_003124c3;
          puVar23 = (undefined1 *)(ulong)uVar16;
        }
        if ((local_108 <= pBVar45) && (puVar23 != (undefined1 *)0x0)) {
          dist_cache[3] = dist_cache[2];
          uVar13 = *(undefined8 *)dist_cache;
          *(undefined8 *)(dist_cache + 1) = uVar13;
          iVar44 = (int)local_108;
          *dist_cache = iVar44;
          iVar35 = (hasher->privat)._H5.num_last_distances_to_check_;
          if (4 < iVar35) {
            dist_cache[4] = iVar44 + -1;
            dist_cache[5] = iVar44 + 1;
            dist_cache[6] = iVar44 + -2;
            dist_cache[7] = iVar44 + 2;
            dist_cache[8] = iVar44 + -3;
            dist_cache[9] = iVar44 + 3;
            if (10 < iVar35) {
              iVar35 = (int)uVar13;
              dist_cache[10] = iVar35 + -1;
              dist_cache[0xb] = iVar35 + 1;
              dist_cache[0xc] = iVar35 + -2;
              dist_cache[0xd] = iVar35 + 2;
              *(ulong *)(dist_cache + 0xe) = CONCAT44(iVar35 + 3,iVar35 + -3);
            }
          }
        }
        uVar16 = (uint)local_170;
        local_c8->insert_len_ = uVar16;
        local_c8->copy_len_ = local_14c << 0x19 | (uint)local_120;
        uVar49 = (ulong)(params->dist).num_direct_distance_codes;
        puVar22 = (undefined1 *)(uVar49 + 0x10);
        if (puVar23 < puVar22) {
          local_c8->dist_prefix_ = (uint16_t)puVar23;
          uVar17 = 0;
        }
        else {
          uVar17 = (params->dist).distance_postfix_bits;
          bVar24 = (byte)uVar17;
          puVar23 = puVar23 + ((4L << (bVar24 & 0x3f)) - uVar49) + -0x10;
          uVar33 = 0x1f;
          if ((uint)puVar23 != 0) {
            for (; (uint)puVar23 >> uVar33 == 0; uVar33 = uVar33 - 1) {
            }
          }
          uVar33 = (uVar33 ^ 0xffffffe0) + 0x1f;
          bVar57 = ((ulong)puVar23 >> ((ulong)uVar33 & 0x3f) & 1) != 0;
          iVar35 = uVar33 - uVar17;
          local_c8->dist_prefix_ =
               (short)((uint)bVar57 + iVar35 * 2 + 0xfffe << (bVar24 & 0x3f)) +
               (short)puVar22 + (~(ushort)(-1 << (bVar24 & 0x1f)) & (ushort)puVar23) |
               (short)iVar35 * 0x400;
          uVar17 = (uint32_t)
                   ((long)puVar23 - ((ulong)bVar57 + 2 << ((byte)uVar33 & 0x3f)) >> (bVar24 & 0x3f))
          ;
        }
        local_c8->dist_extra_ = uVar17;
        if (5 < local_170) {
          if (local_170 < 0x82) {
            uVar16 = 0x1f;
            uVar33 = (uint)(local_170 - 2);
            if (uVar33 != 0) {
              for (; uVar33 >> uVar16 == 0; uVar16 = uVar16 - 1) {
              }
            }
            uVar16 = (int)(local_170 - 2 >> ((char)(uVar16 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                     (uVar16 ^ 0xffffffe0) * 2 + 0x40;
          }
          else if (local_170 < 0x842) {
            uVar33 = 0x1f;
            if (uVar16 - 0x42 != 0) {
              for (; uVar16 - 0x42 >> uVar33 == 0; uVar33 = uVar33 - 1) {
              }
            }
            uVar16 = (uVar33 ^ 0xffe0) + 0x2a;
          }
          else {
            uVar16 = 0x15;
            if (0x1841 < local_170) {
              uVar16 = (uint)(ushort)(0x17 - (local_170 < 0x5842));
            }
          }
        }
        uVar33 = local_14c + (uint)local_120;
        if (uVar33 < 10) {
          uVar34 = uVar33 - 2;
        }
        else if (uVar33 < 0x86) {
          uVar33 = uVar33 - 6;
          uVar34 = 0x1f;
          if (uVar33 != 0) {
            for (; uVar33 >> uVar34 == 0; uVar34 = uVar34 - 1) {
            }
          }
          uVar34 = (int)((ulong)(long)(int)uVar33 >> ((char)(uVar34 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                   (uVar34 ^ 0xffffffe0) * 2 + 0x42;
        }
        else {
          uVar34 = 0x17;
          if (uVar33 < 0x846) {
            uVar34 = 0x1f;
            if (uVar33 - 0x46 != 0) {
              for (; uVar33 - 0x46 >> uVar34 == 0; uVar34 = uVar34 - 1) {
              }
            }
            uVar34 = (uVar34 ^ 0xffe0) + 0x2c;
          }
        }
        uVar3 = (ushort)uVar34;
        uVar15 = (uVar3 & 7) + ((ushort)uVar16 & 7) * 8;
        if ((((local_c8->dist_prefix_ & 0x3ff) == 0) && ((ushort)uVar16 < 8)) && (uVar3 < 0x10)) {
          if (7 < uVar3) {
            uVar15 = uVar15 | 0x40;
          }
        }
        else {
          iVar35 = ((uVar16 & 0xffff) >> 3) * 3 + ((uVar34 & 0xffff) >> 3);
          uVar15 = uVar15 + ((ushort)(0x520d40 >> ((char)iVar35 * '\x02' & 0x1fU)) & 0xc0) +
                            (short)iVar35 * 0x40 + 0x40;
        }
        local_c8->cmd_prefix_ = uVar15;
        *num_literals = *num_literals + local_170;
        pBVar45 = (BrotliEncoderParams *)
                  ((long)(local_120->dictionary).contextual.dict +
                  (long)(pBVar51[-1].dictionary.contextual.dict + 1));
        pBVar47 = pBVar18;
        if (pBVar45 < pBVar18) {
          pBVar47 = pBVar45;
        }
        pBVar39 = (BrotliEncoderParams *)((long)&pBVar51->mode + 2);
        if (local_108 < (BrotliEncoderParams *)((ulong)local_120 >> 2)) {
          pBVar56 = (BrotliEncoderParams *)((long)pBVar45 + (long)local_108 * -4);
          if (pBVar56 < pBVar39) {
            pBVar56 = pBVar39;
          }
          pBVar39 = pBVar56;
          if (pBVar47 < pBVar56) {
            pBVar39 = pBVar47;
          }
        }
        pBVar56 = (BrotliEncoderParams *)
                  ((long)(pBVar51->dictionary).compound.chunks +
                  lVar26 + (long)local_120 * 2 + -0x68);
        local_c8 = local_c8 + 1;
        if (pBVar39 < pBVar47) {
          uVar17 = (hasher->privat)._H35.hb.state;
          uVar16 = (hasher->privat)._H5.block_mask_;
          uVar4 = (hasher->privat)._H6.block_mask_;
          do {
            uVar33 = (uint)(*(int *)(ringbuffer + ((ulong)pBVar39 & ringbuffer_mask)) * 0x1e35a7bd)
                     >> ((byte)uVar17 & 0x1f);
            uVar3 = puVar7[uVar33];
            puVar8[(ulong)(uVar16 & uVar3) + (ulong)(uVar33 << ((byte)uVar4 & 0x1f))] =
                 (uint32_t)pBVar39;
            puVar7[uVar33] = uVar3 + 1;
            pBVar39 = (BrotliEncoderParams *)((long)&pBVar39->mode + 1);
          } while (pBVar47 != pBVar39);
          local_170 = 0;
        }
        else {
          local_170 = 0;
        }
      }
      position = (size_t)pBVar45;
      pBVar45 = (BrotliEncoderParams *)position;
    } while (&((BrotliEncoderParams *)position)->quality < puVar1);
  }
  else {
    local_c8 = commands;
  }
  *last_insert_len = (size_t)(puVar1 + (local_170 - position));
  *num_commands = *num_commands + ((long)local_c8 - (long)commands >> 4);
  return;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}